

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_wconv
                   (char_t *s,char_t end_quote)

{
  char_t *pcVar1;
  byte *pbVar2;
  undefined1 local_30 [7];
  char_t ss;
  gap g;
  byte *pbStack_18;
  char_t end_quote_local;
  char_t *s_local;
  
  g.size._7_1_ = end_quote;
  pbStack_18 = s;
  gap::gap((gap *)local_30);
  do {
    while (((anonymous_namespace)::chartype_table[*pbStack_18] & 4) != 0) {
LAB_00117af7:
      if (*pbStack_18 == g.size._7_1_) {
        pcVar1 = gap::flush((gap *)local_30,pbStack_18);
        *pcVar1 = '\0';
        return pbStack_18 + 1;
      }
      if (((anonymous_namespace)::chartype_table[*pbStack_18] & 8) == 0) {
        if (*pbStack_18 == 0x26) {
          pbStack_18 = strconv_escape(pbStack_18,(gap *)local_30);
        }
        else {
          if (*pbStack_18 == 0) {
            return (char_t *)0x0;
          }
          pbStack_18 = pbStack_18 + 1;
        }
      }
      else if (*pbStack_18 == 0xd) {
        pbVar2 = pbStack_18 + 1;
        *pbStack_18 = 0x20;
        pbStack_18 = pbVar2;
        if (*pbVar2 == 10) {
          gap::push((gap *)local_30,&stack0xffffffffffffffe8,1);
        }
      }
      else {
        *pbStack_18 = 0x20;
        pbStack_18 = pbStack_18 + 1;
      }
    }
    if (((anonymous_namespace)::chartype_table[pbStack_18[1]] & 4) != 0) {
      pbStack_18 = pbStack_18 + 1;
      goto LAB_00117af7;
    }
    if (((anonymous_namespace)::chartype_table[pbStack_18[2]] & 4) != 0) {
      pbStack_18 = pbStack_18 + 2;
      goto LAB_00117af7;
    }
    if (((anonymous_namespace)::chartype_table[pbStack_18[3]] & 4) != 0) {
      pbStack_18 = pbStack_18 + 3;
      goto LAB_00117af7;
    }
    pbStack_18 = pbStack_18 + 4;
  } while( true );
}

Assistant:

static char_t* parse_wconv(char_t* s, char_t end_quote)
		{
			gap g;

			while (true)
			{
				PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_attr_ws));

				if (*s == end_quote)
				{
					*g.flush(s) = 0;

					return s + 1;
				}
				else if (PUGI__IS_CHARTYPE(*s, ct_space))
				{
					if (*s == '\r')
					{
						*s++ = ' ';

						if (*s == '\n') g.push(s, 1);
					}
					else *s++ = ' ';
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return 0;
				}
				else ++s;
			}
		}